

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ForkBranch<kj::Rc<kj::Refcounted>,_true>::get
          (ForkBranch<kj::Rc<kj::Refcounted>,_true> *this,ExceptionOrValue *output)

{
  NullableValue<kj::Exception> *other;
  Refcounted *refcounted;
  Own<kj::Refcounted,_std::nullptr_t> local_28;
  
  other = (NullableValue<kj::Exception> *)((this->super_ForkBranchBase).hub.ptr)->resultRef;
  if (other[1].isSet == true) {
    local_28.ptr = (Refcounted *)other[1].field_1.value.ownFile.content.size_;
    if (local_28.ptr == (Refcounted *)0x0) {
      local_28.ptr = (Refcounted *)0x0;
    }
    else {
      (local_28.ptr)->refcount = (local_28.ptr)->refcount + 1;
    }
    local_28.disposer = &(local_28.ptr)->super_Disposer;
    NullableValue<kj::Rc<kj::Refcounted>>::emplace<kj::Rc<kj::Refcounted>>
              ((NullableValue<kj::Rc<kj::Refcounted>> *)(output + 1),(Rc<kj::Refcounted> *)&local_28
              );
    Own<kj::Refcounted,_std::nullptr_t>::dispose(&local_28);
  }
  else {
    Maybe<kj::Rc<kj::Refcounted>_>::operator=((Maybe<kj::Rc<kj::Refcounted>_> *)(output + 1));
  }
  NullableValue<kj::Exception>::operator=((NullableValue<kj::Exception> *)output,other);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_SOME(value, hubResult.value) {
      output.as<T>().value = copyOrAddRef(value);
    } else {
      output.as<T>().value = kj::none;
    }